

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhosttx.cpp
# Opt level: O1

void __thiscall CVmHostIfcText::~CVmHostIfcText(CVmHostIfcText *this)

{
  CVmHashTable *this_00;
  ulong uVar1;
  
  (this->super_CVmHostIfc)._vptr_CVmHostIfc = (_func_int **)&PTR__CVmHostIfcText_0032a9a8;
  this_00 = this->restab_;
  if (this_00 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(this_00);
    operator_delete(this_00,0x20);
  }
  if (this->ext_cnt_ != 0) {
    uVar1 = 0;
    do {
      lib_free_str(this->ext_[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->ext_cnt_);
  }
  free(this->ext_);
  lib_free_str(this->res_dir_);
  return;
}

Assistant:

CVmHostIfcText::~CVmHostIfcText()
{
    /* delete our hash table */
    delete restab_;

    /* delete our external filenames */
    for (size_t i = 0 ; i < ext_cnt_ ; ++i)
        lib_free_str(ext_[i]);

    /* delete our array of external filename entries */
    t3free(ext_);

    /* delete our resource directory path */
    lib_free_str(res_dir_);
}